

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi_serial_unix.cxx
# Opt level: O2

int ndiSerialFlush(int serial_port,int buffers)

{
  int __queue_selector;
  
  __queue_selector = (buffers != 2) + 1;
  if (buffers == 1) {
    __queue_selector = 0;
  }
  tcflush(serial_port,__queue_selector);
  return 0;
}

Assistant:

ndicapiExport int ndiSerialFlush(int serial_port, int buffers)
{
  int flushtype = TCIOFLUSH;

  if (buffers == NDI_IFLUSH)
  {
    flushtype = TCIFLUSH;
  }
  else if (buffers == NDI_OFLUSH)
  {
    flushtype = TCOFLUSH;
  }

  tcflush(serial_port, flushtype);    /* clear input/output buffers */

  return 0;
}